

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

void device1(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  int iVar2;
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int sock;
  
  line = test_socket_impl((char *)0x2f,2,0x10,(int)in_RCX);
  test_bind_impl((char *)0x30,line,0x102175,in_RCX);
  line_00 = test_socket_impl((char *)0x31,2,0x10,(int)in_RCX);
  test_bind_impl((char *)0x32,line_00,0x102180,in_RCX);
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar2 = nn_errno();
    iVar1 = extraout_EDX;
    if (iVar2 != 0x9523dfd) {
      iVar2 = nn_errno();
      iVar1 = extraout_EDX_00;
      if (iVar2 != 9) goto LAB_001015b7;
    }
    test_close_impl((char *)0x39,line_00,iVar1);
    test_close_impl((char *)0x3a,line,sock);
    return;
  }
LAB_001015b7:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "rc < 0 && (nn_errno () == ETERM || nn_errno () == EBADF)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c",
          0x36);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device1 (NN_UNUSED void *arg)
{
    int rc;
    int deva;
    int devb;

    /*  Intialise the device sockets. */
    deva = test_socket (AF_SP_RAW, NN_PAIR);
    test_bind (deva, SOCKET_ADDRESS_A);
    devb = test_socket (AF_SP_RAW, NN_PAIR);
    test_bind (devb, SOCKET_ADDRESS_B);

    /*  Run the device. */
    rc = nn_device (deva, devb);
    nn_assert (rc < 0 && (nn_errno () == ETERM || nn_errno () == EBADF));

    /*  Clean up. */
    test_close (devb);
    test_close (deva);
}